

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

bool __thiscall license::EventRegistry::turnErrorsIntoWarnings(EventRegistry *this)

{
  bool bVar1;
  pointer paVar2;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_28;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_20;
  iterator it;
  bool eventFound;
  EventRegistry *this_local;
  
  it._M_current._7_1_ = 0;
  local_20._M_current =
       (anon_struct_1288_4_4db92441 *)
       std::vector<AuditEvent,_std::allocator<AuditEvent>_>::begin(&this->logs);
  while( true ) {
    local_28._M_current =
         (anon_struct_1288_4_4db92441 *)
         std::vector<AuditEvent,_std::allocator<AuditEvent>_>::end(&this->logs);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    paVar2 = __gnu_cxx::
             __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
             ::operator->(&local_20);
    if (paVar2->severity == SVRT_ERROR) {
      paVar2 = __gnu_cxx::
               __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
               ::operator->(&local_20);
      paVar2->severity = SVRT_WARN;
      it._M_current._7_1_ = 1;
    }
    __gnu_cxx::
    __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>::
    operator++(&local_20);
  }
  return (bool)(it._M_current._7_1_ & 1);
}

Assistant:

bool EventRegistry::turnErrorsIntoWarnings() {
	bool eventFound = false;
	for (auto it = logs.begin(); it != logs.end(); ++it) {
		if (it->severity == SVRT_ERROR) {
			it->severity = SVRT_WARN;
			eventFound = true;
		}
	}
	return eventFound;
}